

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

Node * __thiscall anon_unknown.dwarf_38e3a9::Db::parseUnqualifiedName(Db *this,NameState *State)

{
  char cVar1;
  char *pcVar2;
  Node **ppNVar3;
  Node **ppNVar4;
  bool bVar5;
  bool bVar6;
  Node *pNVar7;
  undefined **ppuVar8;
  char *pcVar9;
  Node NVar10;
  StringView SVar11;
  StringView S;
  StringView S_00;
  StringView S_01;
  Node *P;
  char *local_38;
  
  if (this->Last == this->First) {
LAB_00196995:
    SVar11.Last = "";
    SVar11.First = "DC";
    pcVar9 = "DC";
    bVar5 = consumeIf(this,SVar11);
    if (bVar5) {
      ppNVar3 = (this->Names).Last;
      ppNVar4 = (this->Names).First;
      do {
        P = parseSourceName(this,(NameState *)pcVar9);
        if (P == (Node *)0x0) {
          return (Node *)0x0;
        }
        pcVar9 = (char *)&P;
        PODSmallVector<(anonymous_namespace)::Node_*,_32UL>::push_back(&this->Names,(Node **)&P);
        pcVar2 = this->First;
      } while ((pcVar2 == this->Last) || (*pcVar2 != 'E'));
      this->First = pcVar2 + 1;
      NVar10 = (Node)popTrailingNodeArray(this,(long)ppNVar3 - (long)ppNVar4 >> 3);
      pNVar7 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x20);
      pNVar7->K = KStructuredBindingName;
      pNVar7->RHSComponentCache = No;
      pNVar7->ArrayCache = No;
      pNVar7->FunctionCache = No;
      ppuVar8 = &PTR_hasRHSComponentSlow_001f8490;
LAB_00196a2e:
      pNVar7->_vptr_Node = (_func_int **)ppuVar8;
      pNVar7[1] = NVar10;
      goto LAB_00196a52;
    }
    pNVar7 = parseOperatorName(this,State);
  }
  else {
    cVar1 = *this->First;
    if (cVar1 == 'U') {
      S.Last = "";
      S.First = "Ut";
      bVar5 = consumeIf(this,S);
      if (bVar5) {
        NVar10 = (Node)parseNumber(this,false);
        pcVar9 = this->First;
        if (pcVar9 == this->Last) {
          return (Node *)0x0;
        }
        if (*pcVar9 != '_') {
          return (Node *)0x0;
        }
        this->First = pcVar9 + 1;
        pNVar7 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x20);
        pNVar7->K = KUnnamedTypeName;
        pNVar7->RHSComponentCache = No;
        pNVar7->ArrayCache = No;
        pNVar7->FunctionCache = No;
        ppuVar8 = &PTR_hasRHSComponentSlow_001f83e0;
        goto LAB_00196a2e;
      }
      S_00.Last = "";
      S_00.First = "Ul";
      bVar5 = consumeIf(this,S_00);
      if (!bVar5) {
        return (Node *)0x0;
      }
      bVar5 = this->ParsingLambdaParams;
      this->ParsingLambdaParams = true;
      S_01.Last = "";
      S_01.First = "vE";
      bVar6 = consumeIf(this,S_01);
      NVar10 = (Node)ZEXT816(0);
      if (!bVar6) {
        ppNVar3 = (this->Names).Last;
        ppNVar4 = (this->Names).First;
        do {
          P = parseType(this);
          if (P == (Node *)0x0) goto LAB_00196b89;
          PODSmallVector<(anonymous_namespace)::Node_*,_32UL>::push_back(&this->Names,&P);
          pcVar9 = this->First;
        } while ((pcVar9 == this->Last) || (*pcVar9 != 'E'));
        this->First = pcVar9 + 1;
        NVar10 = (Node)popTrailingNodeArray(this,(long)ppNVar3 - (long)ppNVar4 >> 3);
      }
      pNVar7 = (Node *)0x0;
      SVar11 = parseNumber(this,false);
      pcVar9 = this->First;
      if (pcVar9 != this->Last) {
        if (*pcVar9 == '_') {
          this->First = pcVar9 + 1;
          local_38 = SVar11.Last;
          pNVar7 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x30);
          pNVar7->K = KClosureTypeName;
          pNVar7->RHSComponentCache = No;
          pNVar7->ArrayCache = No;
          pNVar7->FunctionCache = No;
          pNVar7->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_001f8438;
          pNVar7[1] = NVar10;
          pNVar7[2]._vptr_Node = (_func_int **)SVar11.First;
          *(char **)&pNVar7[2].K = local_38;
        }
        else {
LAB_00196b89:
          pNVar7 = (Node *)0x0;
        }
      }
      this->ParsingLambdaParams = bVar5;
    }
    else {
      if (8 < (byte)(cVar1 - 0x31U)) goto LAB_00196995;
      pNVar7 = parseSourceName(this,State);
    }
  }
  if (pNVar7 == (Node *)0x0) {
    return (Node *)0x0;
  }
LAB_00196a52:
  pNVar7 = parseAbiTags(this,pNVar7);
  return pNVar7;
}

Assistant:

Node *Db::parseUnqualifiedName(NameState *State) {
 // <ctor-dtor-name>s are special-cased in parseNestedName().
 Node *Result;
 if (look() == 'U')
   Result = parseUnnamedTypeName(State);
 else if (look() >= '1' && look() <= '9')
   Result = parseSourceName(State);
 else if (consumeIf("DC")) {
   size_t BindingsBegin = Names.size();
   do {
     Node *Binding = parseSourceName(State);
     if (Binding == nullptr)
       return nullptr;
     Names.push_back(Binding);
   } while (!consumeIf('E'));
   Result = make<StructuredBindingName>(popTrailingNodeArray(BindingsBegin));
 } else
   Result = parseOperatorName(State);
 if (Result != nullptr)
   Result = parseAbiTags(Result);
 return Result;
}